

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O0

Graphics * __thiscall
Game::Graphics::GameInputControlsOverlay_abi_cxx11_
          (Graphics *this,input_controls_display_data_t *gamestatus)

{
  __tuple_element_t<0UL,_tuple<bool,_bool>_> _Var1;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> _Var2;
  __tuple_element_t<0UL,_tuple<bool,_bool>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> *p_Var4;
  ostringstream local_198 [7];
  anon_class_1_1_c1a95091 InputControlLists;
  ostringstream str_os;
  __tuple_element_t<1UL,_tuple<bool,_bool>_> is_in_question_mode;
  __tuple_element_t<0UL,_tuple<bool,_bool>_> is_in_endless_mode;
  input_controls_display_data_t *gamestatus_local;
  
  p_Var3 = std::get<0ul,bool,bool>(gamestatus);
  _Var1 = *p_Var3;
  p_Var4 = std::get<1ul,bool,bool>(gamestatus);
  _Var2 = *p_Var4;
  std::__cxx11::ostringstream::ostringstream(local_198);
  DrawOnlyWhen<Game::Graphics::GameInputControlsOverlay[abi:cxx11](std::tuple<bool,bool>)::__0>
            ((ostream *)local_198,(bool)(~(_Var2 & 1U) & 1),(anon_class_1_1_c1a95091)(_Var1 & 1));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

std::string GameInputControlsOverlay(input_controls_display_data_t gamestatus) {
  const auto is_in_endless_mode = std::get<0>(gamestatus);
  const auto is_in_question_mode = std::get<1>(gamestatus);
  std::ostringstream str_os;
  const auto InputControlLists = [=] {
    std::ostringstream str_os;
    DrawAlways(str_os, Graphics::InputCommandListPrompt);
    DrawOnlyWhen(str_os, is_in_endless_mode,
                 Graphics::EndlessModeCommandListPrompt);
    DrawAlways(str_os, Graphics::InputCommandListFooterPrompt);
    return str_os.str();
  };
  // When game is paused to ask a question, hide regular inut prompts..
  DrawOnlyWhen(str_os, !is_in_question_mode, InputControlLists);
  return str_os.str();
}